

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>::int_writer<int,_fmt::v5::basic_format_specs<wchar_t>_>::hex_writer>
          *f)

{
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> __first;
  unsigned_long __n;
  char_type fill;
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  undefined8 uVar4;
  wchar_t local_54;
  __type local_50;
  
  __n = (ulong)spec->width_ - f->size_;
  if ((ulong)spec->width_ < f->size_ || __n == 0) {
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  local_54 = spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    std::
    __fill_n_a1<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long,wchar_t>
              (&local_50,
               *(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this,
               __n >> 1,&local_54);
    *(ulong *)(this + 0xc) =
         CONCAT44((undefined4)local_50.super_truncating_iterator_base<wchar_t_*>.count_,
                  local_50.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
    *(undefined8 *)(this + 0x14) = local_50._20_8_;
    *(wchar_t **)this = local_50.super_truncating_iterator_base<wchar_t_*>.out_;
    *(ulong *)(this + 8) =
         CONCAT44(local_50.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                  (undefined4)local_50.super_truncating_iterator_base<wchar_t_*>.limit_);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    __n = __n - (__n >> 1);
    uVar1 = *(undefined8 *)this;
    uVar2 = *(undefined8 *)(this + 8);
    sVar3 = *(size_t *)(this + 0x10);
    uVar4 = *(undefined8 *)(this + 0x18);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      std::
      __fill_n_a1<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long,wchar_t>
                (&local_50,
                 *(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this,__n,
                 &local_54);
      *(ulong *)(this + 0xc) =
           CONCAT44((undefined4)local_50.super_truncating_iterator_base<wchar_t_*>.count_,
                    local_50.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
      *(undefined8 *)(this + 0x14) = local_50._20_8_;
      *(wchar_t **)this = local_50.super_truncating_iterator_base<wchar_t_*>.out_;
      *(ulong *)(this + 8) =
           CONCAT44(local_50.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                    (undefined4)local_50.super_truncating_iterator_base<wchar_t_*>.limit_);
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
                    *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this
                  );
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
                  *)f,(truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)this);
    uVar1 = *(undefined8 *)this;
    uVar2 = *(undefined8 *)(this + 8);
    sVar3 = *(size_t *)(this + 0x10);
    uVar4 = *(undefined8 *)(this + 0x18);
  }
  __first.super_truncating_iterator_base<wchar_t_*>.limit_ = uVar2;
  __first.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)uVar1;
  __first.super_truncating_iterator_base<wchar_t_*>.count_ = sVar3;
  __first._24_8_ = uVar4;
  std::
  __fill_n_a1<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long,wchar_t>
            (&local_50,__first,__n,&local_54);
  *(ulong *)(this + 0xc) =
       CONCAT44((undefined4)local_50.super_truncating_iterator_base<wchar_t_*>.count_,
                local_50.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
  *(undefined8 *)(this + 0x14) = local_50._20_8_;
  *(wchar_t **)this = local_50.super_truncating_iterator_base<wchar_t_*>.out_;
  *(ulong *)(this + 8) =
       CONCAT44(local_50.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                (undefined4)local_50.super_truncating_iterator_base<wchar_t_*>.limit_);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }